

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileSystem.hpp
# Opt level: O2

void __thiscall webfront::fs::File::File(File *this,ifstream *ifstream)

{
  this->fileType = nativeFStream;
  (this->data)._M_ptr = (pointer)0x0;
  (this->data)._M_extent._M_extent_value = 0;
  this->readIndex = 0;
  this->size = 0;
  this->eofBit = false;
  (this->encoding)._M_dataplus._M_p = (pointer)&(this->encoding).field_2;
  (this->encoding)._M_string_length = 0;
  (this->encoding).field_2._M_local_buf[0] = '\0';
  std::ifstream::ifstream(&this->fstream,ifstream);
  return;
}

Assistant:

File(std::ifstream ifstream) : fileType{FileType::nativeFStream}, fstream{std::move(ifstream)} {}